

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O0

void __thiscall
StrongConnectedComponents::getStrongConnectedComponents(StrongConnectedComponents *this,int root)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  ulong uVar4;
  reference pvVar5;
  size_type sVar6;
  int *piVar7;
  int in_ESI;
  long in_RDI;
  reference rVar8;
  vector<int,_std::allocator<int>_> scc;
  int next;
  int w;
  int i;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  value_type vVar9;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  value_type in_stack_ffffffffffffff6c;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  vector<int,_std::allocator<int>_> local_58;
  value_type local_3c;
  reference local_38;
  value_type local_28;
  int local_24;
  undefined4 in_stack_fffffffffffffff0;
  
  *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + 1;
  vVar9 = *(value_type *)(in_RDI + 0x90);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_ESI);
  *pvVar3 = vVar9;
  vVar9 = *(value_type *)(in_RDI + 0x90);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)in_ESI);
  *pvVar3 = vVar9;
  rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_stack_ffffffffffffff70,
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffe0,true);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff60,
             (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_24 = 0;
  while( true ) {
    uVar4 = (ulong)local_24;
    pvVar5 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 8),(long)in_ESI);
    sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
    if (sVar6 <= uVar4) break;
    pvVar5 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 8),(long)in_ESI);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)local_24);
    local_28 = *pvVar3;
    local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_ffffffffffffff70,
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_38);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)local_28);
      in_stack_ffffffffffffff6c = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)in_ESI);
      if ((in_stack_ffffffffffffff6c < *pvVar3) &&
         (bVar2 = find_vec<int>((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                                (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                               ), bVar2)) {
        in_stack_ffffffffffffff60 =
             (vector<int,_std::allocator<int>_> *)
             std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_ESI);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)local_28);
        piVar7 = std::min<int>((int *)in_stack_ffffffffffffff60,pvVar3);
        in_stack_ffffffffffffff68 = *piVar7;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_ESI);
        *pvVar3 = in_stack_ffffffffffffff68;
      }
    }
    else {
      getStrongConnectedComponents
                ((StrongConnectedComponents *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 rVar8._M_mask._4_4_);
      in_stack_ffffffffffffff70 =
           (vector<bool,_std::allocator<bool>_> *)
           std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_ESI);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)local_28);
      piVar7 = std::min<int>((int *)in_stack_ffffffffffffff70,pvVar3);
      iVar1 = *piVar7;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_ESI);
      *pvVar3 = iVar1;
    }
    local_24 = local_24 + 1;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_ESI);
  vVar9 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)in_ESI);
  if ((vVar9 == *pvVar3) &&
     (bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffff60), !bVar2)) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1d53a4);
    do {
      pvVar3 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48));
      local_3c = *pvVar3;
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)0x1d53c7);
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffff60,
                 (value_type_conflict3 *)CONCAT44(vVar9,in_stack_ffffffffffffff58));
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)local_3c);
      iVar1 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)in_ESI);
    } while (*pvVar3 < iVar1);
    sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_58);
    if (1 < sVar6) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)in_stack_ffffffffffffff60,
                  (value_type *)CONCAT44(vVar9,in_stack_ffffffffffffff58));
    }
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void StrongConnectedComponents::getStrongConnectedComponents(int root) {
    sccCounter++;
    lowlink[root] = sccCounter;
    number[root] = sccCounter;
    visited[root] = true;
    stack.push_back(root);

    for (int i = 0; i < adjList[root].size(); i++) {
        int w = adjList[root][i];
        if (!visited[w]) {
            getStrongConnectedComponents(w);
            lowlink[root] = std::min(lowlink[root], lowlink[w]);
        }
        else if (number[w] < number[root]) {
            if (find_vec(stack, w)) {
                lowlink[root] = std::min(lowlink[root], number[w]);
            }
        }
    }

    if ((lowlink[root] == number[root]) && !stack.empty()) {
        int next;
        std::vector<int> scc;

        do {
            next = stack.back();
            stack.pop_back();
            scc.push_back(next);
        } while (number[next] > number[root]);

        if (scc.size() > 1) {
            currentSCCs.push_back(scc);
        }
    }
}